

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O0

uint32_t __thiscall BoardIO::ReadIPv4Address(BoardIO *this)

{
  uint32_t uVar1;
  ostream *this_00;
  uint32_t local_1c;
  BoardIO *pBStack_18;
  uint32_t read_data;
  BoardIO *this_local;
  
  pBStack_18 = this;
  uVar1 = GetFirmwareVersion(this);
  if (uVar1 < 7) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "AmpIO::ReadIPv4Address: requires firmware 7 or above");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    local_1c = 0;
    if (this->port != (BasePort *)0x0) {
      (*this->port->_vptr_BasePort[0x23])(this->port,(ulong)this->BoardId,0xb,&local_1c);
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BoardIO::ReadIPv4Address(void) const
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "AmpIO::ReadIPv4Address: requires firmware 7 or above" << std::endl;
        return 0;
    }
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, BoardIO::IP_ADDR, read_data);
    return read_data;
}